

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<int>::append(SmallVectorBase<int> *this,size_type count,int *value)

{
  int iVar1;
  pointer piVar2;
  size_type sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  size_type newCapacity;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  iVar1 = *value;
  newCapacity = this->len + count;
  reserve(this,newCapacity);
  auVar6 = _DAT_00a29400;
  auVar5 = _DAT_00a293f0;
  auVar4 = _DAT_00a293e0;
  if (0 < (long)count) {
    piVar2 = this->data_;
    sVar3 = this->len;
    lVar8 = count - 1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00a29400;
    do {
      auVar11._8_4_ = (int)uVar7;
      auVar11._0_8_ = uVar7;
      auVar11._12_4_ = (int)(uVar7 >> 0x20);
      auVar12 = (auVar11 | auVar5) ^ auVar6;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        piVar2[sVar3 + uVar7] = iVar1;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        piVar2[sVar3 + uVar7 + 1] = iVar1;
      }
      auVar11 = (auVar11 | auVar4) ^ auVar6;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        piVar2[sVar3 + uVar7 + 2] = iVar1;
        piVar2[sVar3 + uVar7 + 3] = iVar1;
      }
      uVar7 = uVar7 + 4;
    } while ((count + 3 & 0xfffffffffffffffc) != uVar7);
  }
  this->len = newCapacity;
  return;
}

Assistant:

void append(size_type count, const T& value) {
        // Make a temporary copy of the value in case it already lives inside our array.
        T temp(value);

        auto newSize = len + count;
        reserve(newSize);

        std::ranges::uninitialized_fill_n(end(), count, temp);
        len = newSize;
    }